

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gen_keys.c
# Opt level: O1

int main(void)

{
  ulong uVar1;
  ulong *puVar2;
  ulong *puVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  ulp_private_key *priv_key;
  ulp_public_key *pub_key;
  ulp_private_key *local_28;
  ulp_public_key *local_20;
  
  local_20 = (ulp_public_key *)0x0;
  local_28 = (ulp_private_key *)0x0;
  iVar5 = ulp_generate_key_pair(0x100,0x80,0x1da7e,0x1fe2f37,0x3f8c027d93dd95,&local_20,&local_28);
  if ((((local_20 != (ulp_public_key *)0x0 && iVar5 == 0) && (local_20->n == 0x100)) &&
      (local_20->l == 0x80)) &&
     (((local_20->q == 0x3f8c027d93dd95 && (local_20->se == 0x1fe2f37)) &&
      (puVar2 = local_20->A, puVar2 != (ulong *)0x0)))) {
    puVar3 = local_20->P;
    if (((local_28 != (ulp_private_key *)0x0 && puVar3 != (ulong *)0x0) && (local_28->n == 0x100))
       && ((local_28->l == 0x80 &&
           (((local_28->q == 0x3f8c027d93dd95 && (local_28->S != (uint64_t *)0x0)) &&
            (*puVar2 < 0x3f8c027d93dd95)))))) {
      uVar6 = 0xffffffffffffffff;
      do {
        if (uVar6 == 0xfffe) goto LAB_001012d0;
        uVar1 = uVar6 + 1;
        lVar4 = uVar6 + 2;
        uVar6 = uVar1;
      } while (puVar2[lVar4] < 0x3f8c027d93dd95);
      if (0xfffe < uVar1) {
LAB_001012d0:
        if (*puVar3 < 0x3f8c027d93dd95) {
          bVar7 = false;
          uVar6 = 0;
          do {
            if (0x1da7d < local_28->S[uVar6]) break;
            bVar7 = 0x7ffe < uVar6;
            if (uVar6 == 0x7fff) goto LAB_00101304;
            lVar4 = uVar6 + 1;
            uVar6 = uVar6 + 1;
          } while (puVar3[lVar4] < 0x3f8c027d93dd95);
          if (bVar7) {
LAB_00101304:
            ulp_free_public_key(local_20);
            iVar5 = 0;
            goto LAB_00101317;
          }
        }
      }
    }
  }
  ulp_free_public_key(local_20);
  iVar5 = 1;
LAB_00101317:
  ulp_free_private_key(local_28);
  return iVar5;
}

Assistant:

int main() {

    ulp_public_key* pub_key = NULL;
    ulp_private_key* priv_key = NULL;

    size_t n = 256;
    size_t l = 128;
    uint64_t sk = 121470;
    uint64_t se = 33435447;
    uint64_t q = 17886865857437077;

    // generate key pair and do sanity checks

    if(ulp_generate_key_pair(n, l, sk, se, q, &pub_key, &priv_key) != 0)
        goto error;

    if(pub_key == NULL || pub_key->n != n || pub_key->l != l || pub_key->q != q || pub_key->se != se || pub_key->A == NULL || pub_key->P == NULL)
        goto error;

    if(priv_key == NULL || priv_key->n != n || priv_key->l != l || priv_key->q != q || priv_key->S == NULL)
        goto error;

    // check if values are below thresholds

    for(size_t i = 0; i < n*n; i++) {
        if(pub_key->A[i] >= q)
            goto error;
    }

    for(size_t i = 0; i < l*n; i++) {
        if(pub_key->P[i] >= q)
            goto error;
        if(priv_key->S[i] >= sk)
            goto error;
    }

    ulp_free_public_key(pub_key);
    ulp_free_private_key(priv_key);
    return 0;


    error:
        ulp_free_public_key(pub_key);
        ulp_free_private_key(priv_key);
        return 1;

}